

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

UdpBodySyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::UdpBodySyntax,slang::syntax::UdpBodySyntax_const&>
          (BumpAllocator *this,UdpBodySyntax *args)

{
  UdpBodySyntax *this_00;
  
  this_00 = (UdpBodySyntax *)allocate(this,0xb0,8);
  slang::syntax::UdpBodySyntax::UdpBodySyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }